

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

void send_wm_state_event(Window wnd,int add,Atom prop)

{
  unsigned_long in_stack_00000008;
  
  send_wm_event(wnd,fl_NET_WM_STATE,(ulong)(add != 0),prop,0,0,in_stack_00000008);
  return;
}

Assistant:

static void send_wm_state_event(Window wnd, int add, Atom prop) {
  send_wm_event(wnd, fl_NET_WM_STATE,
                add ? _NET_WM_STATE_ADD : _NET_WM_STATE_REMOVE, prop);
}